

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O1

int libebml::CodedValueLengthSigned(int64 Length,int CodedSize,binary *OutBuffer)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar2 = Length + 0x3fU;
  if ((((0x7e < Length + 0x3fU) && (uVar2 = Length + 0x1fffU, 0x3ffe < Length + 0x1fffU)) &&
      (uVar2 = Length + 0xfffffU, 0x1ffffe < Length + 0xfffffU)) &&
     (uVar2 = Length, Length + 0x7ffffffU < 0xfffffff)) {
    uVar2 = Length + 0x7ffffffU;
  }
  *OutBuffer = (binary)(1 << (8U - (char)CodedSize & 0x1f));
  uVar3 = 0xff;
  if (1 < CodedSize) {
    lVar1 = (ulong)(uint)CodedSize - 1;
    uVar3 = 0xff;
    do {
      OutBuffer[lVar1] = (binary)uVar2;
      uVar2 = uVar2 >> 8;
      uVar3 = uVar3 >> 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  *OutBuffer = *OutBuffer | (byte)uVar3 & (byte)uVar2;
  return CodedSize;
}

Assistant:

int CodedValueLengthSigned(int64 Length, int CodedSize, binary * OutBuffer)
{
  if (Length > -64 && Length < 64) // 2^6
    Length += 63;
  else if (Length > -8192 && Length < 8192) // 2^13
    Length += 8191;
  else if (Length > -1048576L && Length < 1048576L) // 2^20
    Length += 1048575L;
  else if (Length > -134217728L && Length < 134217728L) // 2^27
    Length += 134217727L;

  return CodedValueLength(Length, CodedSize, OutBuffer);
}